

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
soplex::Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::Array
          (Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *this,
          Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *old)

{
  (this->data).
  super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).
  super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).
  super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
  ::operator=(&this->data,&old->data);
  return;
}

Assistant:

Array(const Array& old)
   {
      data = old.data;
   }